

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree
          (TaprootScriptTree *this,uint8_t leaf_version,Script *script,NetType network_type)

{
  long lVar1;
  CfdException *this_00;
  byte bVar2;
  long lVar3;
  byte local_49;
  undefined1 local_48 [32];
  
  local_49 = leaf_version;
  TapBranch::TapBranch(&this->super_TapBranch,network_type);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_007fc8a8;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TapBranch).has_leaf_ = true;
  bVar2 = 0xc4;
  if (local_49 != 0xc0) {
    bVar2 = local_49;
  }
  if ((this->super_TapBranch).is_elements_ == false) {
    bVar2 = local_49;
  }
  (this->super_TapBranch).leaf_version_ = bVar2;
  Script::operator=(&(this->super_TapBranch).script_,script);
  if (local_49 != 0x66) {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 == 0x20) goto LAB_004aa88a;
      lVar1 = lVar3 + 4;
    } while (*(uint *)((long)TaprootUtil::IsValidLeafVersion::kValidLeafVersions + lVar3 + 4) !=
             (uint)local_49);
    if (lVar3 == 0x20) {
LAB_004aa88a:
      if (((local_49 & 1) != 0) || (0x3e < (byte)(local_49 + 0x40))) {
        local_48._0_8_ = "cfdcore_taproot.cpp";
        local_48._8_4_ = 0x21b;
        local_48._16_8_ = "TaprootScriptTree";
        logger::log<unsigned_char&>
                  ((CfdSourceLocation *)local_48,kCfdLogLevelWarning,
                   "Unsupported leaf version. [{}]",&local_49);
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        local_48._0_8_ = local_48 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"Unsupported leaf version.","");
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_48);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  return;
}

Assistant:

TaprootScriptTree::TaprootScriptTree(
    uint8_t leaf_version, const Script& script, NetType network_type)
    : TapBranch(network_type) {
  has_leaf_ = true;
  leaf_version_ = leaf_version;
  if (is_elements_ && (leaf_version_ == kTapScriptLeafVersion)) {
    leaf_version_ = kElementsTapScriptLeafVersion;
  }
  script_ = script;
  if (!TaprootUtil::IsValidLeafVersion(leaf_version)) {
    warn(CFD_LOG_SOURCE, "Unsupported leaf version. [{}]", leaf_version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
}